

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

string * __thiscall
t_rs_generator::rust_sync_service_call_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc,
          string *field_prefix)

{
  t_struct *tstruct;
  ostringstream func_args;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  tstruct = tfunc->arglist_;
  if ((tstruct != (t_struct *)0x0) &&
     ((tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    struct_to_invocation(&local_1c0,this,tstruct,field_prefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_sync_service_call_invocation(t_function* tfunc, const string& field_prefix) {
  ostringstream func_args;
  func_args << "(";

  if (has_args(tfunc)) {
    func_args << struct_to_invocation(tfunc->get_arglist(), field_prefix);
  }

  func_args << ")";
  return func_args.str();
}